

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

bool Cipher::generateClustersInitialGuess
               (TParameters *params,TSimilarityMap *ccMap,TClusters *clusters)

{
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> __last;
  value_type vVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  const_reference this;
  const_reference pvVar6;
  reference pvVar7;
  mapped_type *pmVar8;
  reference piVar9;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RSI;
  long in_RDI;
  reference rVar10;
  reference rVar11;
  int *cid_2;
  iterator __end1;
  iterator __begin1;
  TClusters *__range1;
  int *cid_1;
  iterator __end2_1;
  iterator __begin2_1;
  TClusters *__range2_1;
  int *cid;
  iterator __end2;
  iterator __begin2;
  TClusters *__range2;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> used_1;
  int cnt;
  int p;
  int cidj;
  int cidi;
  int j_1;
  int i_2;
  int k;
  vector<bool,_std::allocator<bool>_> used;
  int j;
  int i_1;
  vector<Pair,_std::allocator<Pair>_> ccPairs;
  int i;
  int nClusters;
  int n;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  allocator_type *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> in_stack_fffffffffffffe00;
  size_type in_stack_fffffffffffffe08;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe10;
  _Bit_type in_stack_fffffffffffffe28;
  _Bit_type *in_stack_fffffffffffffe30;
  bool local_1c1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_178;
  vector<int,_std::allocator<int>_> *local_170;
  reference local_168;
  int *local_160;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_158;
  vector<int,_std::allocator<int>_> *local_150;
  reference local_148;
  int *local_140;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_138;
  vector<int,_std::allocator<int>_> *local_130;
  int local_f4;
  reference local_f0;
  int local_dc;
  reference local_d8;
  reference local_c8;
  value_type local_b8;
  value_type local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  Pair *local_78;
  Pair *local_70;
  int local_58;
  int local_54;
  TValueCC local_50;
  int local_48;
  int local_44;
  vector<Pair,_std::allocator<Pair>_> local_40;
  int local_24;
  int local_20;
  int local_1c;
  vector<int,_std::allocator<int>_> *local_18;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar4 = std::
          vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ::size(in_RSI);
  local_20 = (int)sVar4;
  local_1c = local_20;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  for (local_24 = 0; iVar3 = local_24, local_24 < local_1c; local_24 = local_24 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_24);
    *pvVar5 = iVar3;
  }
  std::vector<Pair,_std::allocator<Pair>_>::vector((vector<Pair,_std::allocator<Pair>_> *)0x183c5d);
  for (local_44 = 0; iVar3 = local_44, local_44 < local_1c + -1; local_44 = local_44 + 1) {
    while (local_48 = iVar3 + 1, local_48 < local_1c) {
      local_58 = local_44;
      local_54 = local_48;
      this = std::
             vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
             ::operator[](local_10,(long)local_44);
      pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](this,(long)local_48);
      local_50 = pvVar6->cc;
      std::
      vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>
      ::
      emplace_back<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>
                ((vector<Pair,_std::allocator<Pair>_> *)in_stack_fffffffffffffe00._M_current,
                 (Pair *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      iVar3 = local_48;
    }
  }
  local_70 = (Pair *)std::vector<Pair,_std::allocator<Pair>_>::begin
                               ((vector<Pair,_std::allocator<Pair>_> *)
                                CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  local_78 = (Pair *)std::vector<Pair,_std::allocator<Pair>_>::end
                               ((vector<Pair,_std::allocator<Pair>_> *)
                                CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  __last._M_current._4_4_ = in_stack_fffffffffffffdfc;
  __last._M_current._0_4_ = in_stack_fffffffffffffdf8;
  std::
  sort<__gnu_cxx::__normal_iterator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair*,std::vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>>>
            (in_stack_fffffffffffffe00,__last);
  std::allocator<bool>::allocator((allocator<bool> *)0x183dbc);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffe00._M_current,
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),in_stack_fffffffffffffdf0
            );
  std::allocator<bool>::~allocator((allocator<bool> *)0x183de2);
  rVar11._M_mask = in_stack_fffffffffffffe28;
  rVar11._M_p = in_stack_fffffffffffffe30;
  local_a8 = 0;
  while( true ) {
    iVar3 = local_a8;
    sVar4 = std::vector<Pair,_std::allocator<Pair>_>::size(&local_40);
    if ((int)sVar4 <= iVar3) break;
    pvVar7 = std::vector<Pair,_std::allocator<Pair>_>::operator[](&local_40,(long)local_a8);
    local_ac = pvVar7->i;
    pvVar7 = std::vector<Pair,_std::allocator<Pair>_>::operator[](&local_40,(long)local_a8);
    local_b0 = pvVar7->j;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_ac);
    iVar3 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_b0);
    if (iVar3 != *pvVar5) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_ac);
      local_b4 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_b0);
      local_b8 = *pvVar5;
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      local_c8 = rVar10;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
      local_1c1 = true;
      if (!bVar2) {
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        local_d8 = rVar11;
        local_1c1 = std::_Bit_reference::operator_cast_to_bool(&local_d8);
      }
      if (local_1c1 == false) {
        if (local_b8 < local_b4) {
          std::swap<int>(&local_b4,&local_b8);
        }
        for (local_dc = 0; local_dc < local_1c; local_dc = local_dc + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_dc);
          vVar1 = local_b4;
          if (*pvVar5 == local_b8) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_dc);
            *pvVar5 = vVar1;
          }
        }
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        in_stack_fffffffffffffe10 = (vector<bool,_std::allocator<bool>_> *)rVar10._M_mask;
        local_f0 = rVar10;
        std::_Bit_reference::operator=(&local_f0,true);
        local_20 = local_20 + -1;
        if (local_20 <= *(int *)(local_8 + 4)) break;
      }
    }
    local_a8 = local_a8 + 1;
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x1840fd)
  ;
  local_f4 = 0;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x184115)
  ;
  local_130 = local_18;
  local_138._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  local_140 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffdf0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    if (!bVar2) break;
    local_148 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_138);
    pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)rVar11._M_p,(key_type_conflict *)rVar11._M_mask);
    if (*pmVar8 < 1) {
      iVar3 = local_f4 + 1;
      local_f4 = iVar3;
      in_stack_fffffffffffffe00._M_current =
           (Pair *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)rVar11._M_p,(key_type_conflict *)rVar11._M_mask);
      (in_stack_fffffffffffffe00._M_current)->i = iVar3;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_138);
  }
  local_150 = local_18;
  local_158._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  local_160 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffdf0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    if (!bVar2) break;
    local_168 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_158);
    in_stack_fffffffffffffdf0 =
         (allocator_type *)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator[]
                   ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    rVar11._M_p,(key_type_conflict *)rVar11._M_mask);
    *local_168 = *(int *)in_stack_fffffffffffffdf0 + -1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_158);
  }
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x1842d3)
  ;
  local_170 = local_18;
  local_178._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffdf0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    if (!bVar2) {
      std::vector<Pair,_std::allocator<Pair>_>::~vector
                ((vector<Pair,_std::allocator<Pair>_> *)in_stack_fffffffffffffe00._M_current);
      return true;
    }
    piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_178);
    in_stack_fffffffffffffdef = false;
    if (-1 < *piVar9) {
      in_stack_fffffffffffffdef = *piVar9 < *(int *)(local_8 + 4);
    }
    if ((bool)in_stack_fffffffffffffdef == false) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_178);
  }
  __assert_fail("cid >= 0 && cid < params.maxClusters",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                ,0x3a4,
                "bool Cipher::generateClustersInitialGuess(const TParameters &, const TSimilarityMap &, TClusters &)"
               );
}

Assistant:

bool generateClustersInitialGuess(
            const TParameters & params,
            const TSimilarityMap & ccMap,
            TClusters & clusters) {
        int n = ccMap.size();

        int nClusters = n;
        clusters.resize(n);
        for (int i = 0; i < n; ++i) {
            clusters[i] = i;
        }

        struct Pair {
            int i;
            int j;
            double cc;

            bool operator < (const Pair & a) const { return cc > a.cc; }
        };

        std::vector<Pair> ccPairs;
        for (int i = 0; i < n - 1; ++i) {
            for (int j = i + 1; j < n; ++j) {
                ccPairs.emplace_back(Pair{i, j, ccMap[i][j].cc});
            }
        }

        std::sort(ccPairs.begin(), ccPairs.end());

        {
            std::vector<bool> used(n);

            for (int k = 0; k < (int) ccPairs.size(); ++k) {
                int i = ccPairs[k].i;
                int j = ccPairs[k].j;

                if (clusters[i] == clusters[j]) continue;

                int cidi = clusters[i];
                int cidj = clusters[j];

                if (used[cidi] || used[cidj]) continue;

                if (cidi > cidj) {
                    std::swap(cidi, cidj);
                }

                for (int p = 0; p < n; ++p) {
                    if (clusters[p] == cidj) {
                        clusters[p] = cidi;
                    }
                }
                used[cidj] = true;
                --nClusters;

                if (nClusters <= params.maxClusters) break;
            }
        }

        {
            int cnt = 0;
            std::map<int, int> used;
            for (auto & cid : clusters) {
                if (used[cid] > 0) continue;
                used[cid] = ++cnt;
            }

            for (auto & cid : clusters) {
                cid = used[cid] - 1;
            }
        }

        //printf("nClusters = %d\n", nClusters);
        for (auto & cid : clusters) {
            assert(cid >= 0 && cid < params.maxClusters);
        }

        return true;
    }